

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_point.cpp
# Opt level: O2

int metaIndex(lua_State *L)

{
  dll_lua_pushnumber p_Var1;
  bool bVar2;
  undefined8 *puVar3;
  char *pcVar4;
  Variable *pVVar5;
  string *psVar6;
  code *pcVar7;
  dll_lua_pushstring p_Var8;
  allocator local_49;
  Idx<Variable> var;
  string k;
  
  puVar3 = (undefined8 *)(*lua_touserdata)(L,1);
  var._0_8_ = *puVar3;
  var._arena = (ArenaClass *)puVar3[1];
  pcVar4 = (*lua_tolstring)(L,2,(size_t *)0x0);
  std::__cxx11::string::string((string *)&k,pcVar4,&local_49);
  bVar2 = std::operator==(&k,"name");
  p_Var8 = lua_pushstring;
  if (bVar2) {
    pVVar5 = Idx<Variable>::operator->(&var);
    psVar6 = &pVVar5->name;
  }
  else {
    bVar2 = std::operator==(&k,"value");
    p_Var8 = lua_pushstring;
    if (bVar2) {
      pVVar5 = Idx<Variable>::operator->(&var);
      psVar6 = &pVVar5->value;
    }
    else {
      bVar2 = std::operator==(&k,"valueType");
      p_Var1 = lua_pushnumber;
      if (bVar2) {
        pVVar5 = Idx<Variable>::operator->(&var);
        (*p_Var1)(L,(double)pVVar5->valueType);
        goto LAB_00143933;
      }
      bVar2 = std::operator==(&k,"valueTypeName");
      p_Var8 = lua_pushstring;
      if (!bVar2) {
        bVar2 = std::operator==(&k,"addChild");
        if (bVar2) {
          pcVar7 = metaAddChild;
        }
        else {
          bVar2 = std::operator==(&k,"query");
          if (!bVar2) {
            (*lua_pushnil)(L);
            goto LAB_00143933;
          }
          pcVar7 = metaQuery;
        }
        (*lua_pushcclosure)(L,pcVar7,0);
        goto LAB_00143933;
      }
      pVVar5 = Idx<Variable>::operator->(&var);
      psVar6 = &pVVar5->valueTypeName;
    }
  }
  (*p_Var8)(L,(psVar6->_M_dataplus)._M_p);
LAB_00143933:
  std::__cxx11::string::~string((string *)&k);
  return 1;
}

Assistant:

int metaIndex(lua_State* L)
{
	auto* pVar = (Idx<Variable>*)lua_touserdata(L, 1);
	auto var = *pVar;
	const std::string k = lua_tostring(L, 2);
	if (k == "name")
	{
		lua_pushstring(L, var->name.c_str());
	}
	else if (k == "value")
	{
		lua_pushstring(L, var->value.c_str());
	}
	else if (k == "valueType")
	{
		lua_pushnumber(L, var->valueType);
	}
	else if (k == "valueTypeName")
	{
		lua_pushstring(L, var->valueTypeName.c_str());
	}
	else if (k == "addChild")
	{
		lua_pushcfunction(L, metaAddChild);
	}
	else if (k == "query")
	{
		lua_pushcfunction(L, metaQuery);
	}
	else
	{
		lua_pushnil(L);
	}
	return 1;
}